

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void prvTidyFreeAttrTable(TidyDocImpl *doc)

{
  _AttrHash *p_Var1;
  Attribute *pAVar2;
  ctmbstr s1;
  AttrHash *pAVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  _AttrHash **pp_Var7;
  char *pcVar8;
  AttrHash *pAVar9;
  char cVar10;
  AttrHash *pAVar11;
  uint i;
  long lVar12;
  
  lVar12 = 0;
  do {
    pAVar3 = (doc->attribs).hashtab[lVar12];
    while (pAVar3 != (AttrHash *)0x0) {
      p_Var1 = pAVar3->next;
      (*doc->allocator->vtbl->free)(doc->allocator,pAVar3);
      pAVar3 = p_Var1;
    }
    (doc->attribs).hashtab[lVar12] = (AttrHash *)0x0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xb2);
  prvTidyFreeAnchors(doc);
  pAVar2 = (doc->attribs).declared_attr_list;
  do {
    if (pAVar2 == (Attribute *)0x0) {
      return;
    }
    (doc->attribs).declared_attr_list = pAVar2->next;
    s1 = pAVar2->name;
    cVar10 = *s1;
    if (cVar10 == '\0') {
      uVar6 = 0;
    }
    else {
      uVar4 = 0;
      pcVar8 = s1;
      do {
        pcVar8 = pcVar8 + 1;
        uVar4 = uVar4 * 0x1f + (int)cVar10;
        cVar10 = *pcVar8;
      } while (cVar10 != '\0');
      uVar6 = (ulong)(uVar4 % 0xb2);
    }
    pAVar3 = (doc->attribs).hashtab[uVar6];
    if (pAVar3 != (AttrHash *)0x0) {
      pAVar11 = (AttrHash *)0x0;
      do {
        pAVar9 = pAVar3;
        if (pAVar9->attr == (Attribute *)0x0) break;
        iVar5 = prvTidytmbstrcmp(s1,pAVar9->attr->name);
        pAVar3 = pAVar9->next;
        if (iVar5 == 0) {
          pp_Var7 = &pAVar11->next;
          if (pAVar11 == (AttrHash *)0x0) {
            pp_Var7 = (doc->attribs).hashtab + uVar6;
          }
          *pp_Var7 = pAVar3;
          (*doc->allocator->vtbl->free)(doc->allocator,pAVar9);
          break;
        }
        pAVar11 = pAVar9;
      } while (pAVar3 != (_AttrHash *)0x0);
    }
    (*doc->allocator->vtbl->free)(doc->allocator,pAVar2->name);
    (*doc->allocator->vtbl->free)(doc->allocator,pAVar2);
    pAVar2 = (doc->attribs).declared_attr_list;
  } while( true );
}

Assistant:

void TY_(FreeAttrTable)( TidyDocImpl* doc )
{
    attrsEmptyHash( doc, &doc->attribs );
    TY_(FreeAnchors)( doc );
    FreeDeclaredAttributes( doc );
}